

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

string * __thiscall
argstest::Group::GetErrorMsg_abi_cxx11_(string *__return_storage_ptr__,Group *this)

{
  pointer pcVar1;
  __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
  _Var2;
  
  if ((this->super_Base).error == None) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<argstest::Base*const*,std::vector<argstest::Base*,std::allocator<argstest::Base*>>>,__gnu_cxx::__ops::_Iter_pred<argstest::Group::GetErrorMsg[abi:cxx11]()const::_lambda(argstest::Base_const*)_1_>>
                      ((this->children).
                       super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->children).
                       super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    if (_Var2._M_current ==
        (this->children).super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (*(*_Var2._M_current)->_vptr_Base[0x10])(__return_storage_ptr__);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->super_Base).errorMsg._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->super_Base).errorMsg._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetErrorMsg() const override
            {
                if (error != Error::None)
                {
                    return errorMsg;
                }

                auto it = std::find_if(Children().begin(), Children().end(), [](const Base *child){return child->GetError() != Error::None;});
                if (it == Children().end())
                {
                    return "";
                } else
                {
                    return (*it)->GetErrorMsg();
                }
            }